

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

bool glslang::anon_unknown_0::ValidVersion
               (BuiltInFunction *function,int version,EProfile profile,SpvVersion *param_4)

{
  bool bVar1;
  const_iterator pVVar2;
  Versioning *v;
  const_iterator __end2;
  const_iterator __begin2;
  span<const_glslang::(anonymous_namespace)::Versioning> *__range2;
  SpvVersion *param_3_local;
  EProfile profile_local;
  int version_local;
  BuiltInFunction *function_local;
  
  bVar1 = span<const_glslang::(anonymous_namespace)::Versioning>::empty(&function->versioning);
  if (bVar1) {
    function_local._7_1_ = true;
  }
  else {
    __end2 = span<const_glslang::(anonymous_namespace)::Versioning>::begin(&function->versioning);
    pVVar2 = span<const_glslang::(anonymous_namespace)::Versioning>::end(&function->versioning);
    for (; __end2 != pVVar2; __end2 = __end2 + 1) {
      if (((__end2->profiles & profile) != EBadProfile) &&
         ((__end2->minCoreVersion <= version ||
          ((0 < __end2->numExtensions && (__end2->minExtendedVersion <= version)))))) {
        return true;
      }
    }
    function_local._7_1_ = false;
  }
  return function_local._7_1_;
}

Assistant:

bool ValidVersion(const BuiltInFunction& function, int version, EProfile profile, const SpvVersion& /* spVersion */)
{
    // nullptr means always valid
    if (function.versioning.empty())
        return true;

    // check for what is said about our current profile
    for (const auto& v : function.versioning) {
        if ((v.profiles & profile) != 0) {
            if (v.minCoreVersion <= version || (v.numExtensions > 0 && v.minExtendedVersion <= version))
                return true;
        }
    }

    return false;
}